

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool __thiscall
caffe::HDF5DataParameter::MergePartialFromCodedStream
          (HDF5DataParameter *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  string *value;
  char *data;
  UnknownFieldSet *unknown_fields;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  HDF5DataParameter *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
LAB_00791fcb:
  do {
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if ((input->buffer_ < input->buffer_end_) &&
       (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*input->buffer_;
      google::protobuf::io::CodedInputStream::Advance(input,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) {
LAB_007922e3:
      if ((tag_00 == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      unknown_fields = mutable_unknown_fields(this);
      bVar1 = google::protobuf::internal::WireFormat::SkipField(input,tag_00,unknown_fields);
    }
    else {
      iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
      if (iVar2 == 1) {
        if ((tag_00 & 0xff) != 10) goto LAB_007922e3;
        value = mutable_source_abi_cxx11_(this);
        bVar1 = google::protobuf::internal::WireFormatLite::ReadString(input,value);
        if (!bVar1) {
          return false;
        }
        source_abi_cxx11_(this);
        data = (char *)std::__cxx11::string::data();
        source_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                  (data,iVar2,PARSE,"caffe.HDF5DataParameter.source");
        goto LAB_00791fcb;
      }
      if (iVar2 == 2) {
        if ((tag_00 & 0xff) != 0x10) goto LAB_007922e3;
        set_has_batch_size(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (input,&this->batch_size_);
      }
      else {
        if ((iVar2 != 3) || ((tag_00 & 0xff) != 0x18)) goto LAB_007922e3;
        set_has_shuffle(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->shuffle_);
      }
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool HDF5DataParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.HDF5DataParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string source = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_source()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->source().data(), this->source().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.HDF5DataParameter.source");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 batch_size = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_batch_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &batch_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool shuffle = 3 [default = false];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_shuffle();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &shuffle_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.HDF5DataParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.HDF5DataParameter)
  return false;
#undef DO_
}